

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# res0.c
# Opt level: O2

int res1_forward(oggpack_buffer *opb,vorbis_block *vb,vorbis_look_residue *vl,int **in,int *nonzero,
                int ch,long **partword,int submap)

{
  long lVar1;
  _func_int_oggpack_buffer_ptr_int_ptr_int_codebook_ptr *p_Var2;
  _func_int_oggpack_buffer_ptr_int_ptr_int_codebook_ptr *encode;
  int ch_00;
  
  p_Var2 = (_func_int_oggpack_buffer_ptr_int_ptr_int_codebook_ptr *)0x0;
  encode = (_func_int_oggpack_buffer_ptr_int_ptr_int_codebook_ptr *)(ulong)(uint)ch;
  if (ch < 1) {
    encode = p_Var2;
  }
  ch_00 = 0;
  for (; encode != p_Var2; p_Var2 = p_Var2 + 1) {
    if (nonzero[(long)p_Var2] != 0) {
      lVar1 = (long)ch_00;
      ch_00 = ch_00 + 1;
      in[lVar1] = in[(long)p_Var2];
    }
  }
  if (ch_00 != 0) {
    _01forward(opb,vl,in,ch_00,partword,encode);
  }
  return 0;
}

Assistant:

int res1_forward(oggpack_buffer *opb,vorbis_block *vb,vorbis_look_residue *vl,
                 int **in,int *nonzero,int ch, long **partword, int submap){
  int i,used=0;
  (void)vb;
  for(i=0;i<ch;i++)
    if(nonzero[i])
      in[used++]=in[i];

  if(used){
#ifdef TRAIN_RES
    return _01forward(opb,vl,in,used,partword,_encodepart,submap);
#else
    (void)submap;
    return _01forward(opb,vl,in,used,partword,_encodepart);
#endif
  }else{
    return(0);
  }
}